

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void smooth_v_predictor(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left)

{
  int iVar1;
  ulong uVar2;
  int c;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  byte local_24 [3];
  uint8_t local_21;
  uint8_t weights [2];
  uint8_t pixels [2];
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar2 = uVar4;
  }
  local_21 = left[(long)bh + -1];
  uVar5 = (ulong)(uint)bh;
  if (bh < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      local_24[2] = above[uVar3];
      local_24[0] = (&DAT_0042fd1c)[uVar4 + (uint)bh];
      local_24[1] = -(&DAT_0042fd1c)[uVar4 + (uint)bh];
      iVar1 = 0;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        iVar1 = iVar1 + (uint)local_24[lVar6 + 2] * (uint)local_24[lVar6];
      }
      dst[uVar3] = (uint8_t)((uint)(iVar1 + 0x80) >> 8);
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void smooth_v_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint8_t *above,
                                      const uint8_t *left) {
  const uint8_t below_pred = left[bh - 1];  // estimated by bottom-left pixel
  const uint8_t *const sm_weights = smooth_weights + bh - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint8_t pixels[] = { above[c], below_pred };
      const uint8_t weights[] = { sm_weights[r], scale - sm_weights[r] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[r]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}